

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

double __thiscall
despot::PocmanApproxScenarioUpperBound::Value
          (PocmanApproxScenarioUpperBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  ACT_TYPE AVar4;
  int iVar5;
  ulong uVar6;
  size_type sVar7;
  const_reference ppSVar8;
  int *piVar9;
  size_t sVar10;
  OBS_TYPE OVar11;
  Coord *pCVar12;
  reference pvVar13;
  double dVar14;
  __type _Var15;
  double dVar16;
  double local_f8;
  int local_ac;
  double dStack_a8;
  int g_1;
  double dist;
  int g;
  undefined8 local_94;
  Coord ghost_pos;
  int dist_2;
  bool seen_ghost;
  int obs;
  int act;
  int local_6c;
  undefined8 uStack_68;
  int dist_1;
  Coord food_pos;
  int local_50;
  int local_4c;
  int i_1;
  int max_dist;
  double value;
  PocmanState *state;
  double dStack_30;
  int i;
  double total_value;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  PocmanApproxScenarioUpperBound *this_local;
  
  dStack_30 = 0.0;
  state._4_4_ = 0;
  total_value = (double)history;
  history_local = (History *)streams;
  streams_local = (RandomStreams *)particles;
  particles_local = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this;
  do {
    uVar6 = (ulong)state._4_4_;
    sVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local);
    if (sVar7 <= uVar6) {
      return dStack_30;
    }
    ppSVar8 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local,
                         (long)state._4_4_);
    value = (double)*ppSVar8;
    _i_1 = 0.0;
    local_4c = 0;
    for (local_50 = 0;
        sVar7 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)((long)value + 0x58)),
        (ulong)(long)local_50 < sVar7; local_50 = local_50 + 1) {
      _food_pos = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)((long)value + 0x58),
                             (long)local_50);
      bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&food_pos);
      if (bVar3) {
        uStack_68 = Grid<int>::GetCoord(&this->pocman_->maze_,local_50);
        local_6c = despot::Coord::ManhattanDistance(*(undefined8 *)((long)value + 0x20),uStack_68);
        dVar1 = this->pocman_->reward_eat_food_;
        dVar14 = Globals::Discount(local_6c);
        _i_1 = dVar1 * dVar14 + _i_1;
        piVar9 = std::max<int>(&local_4c,&local_6c);
        local_4c = *piVar9;
      }
    }
    dVar1 = this->pocman_->reward_clear_level_;
    _Var15 = std::pow<double,int>(__Init,local_4c);
    _i_1 = dVar1 * _Var15 + _i_1;
    dVar1 = this->pocman_->reward_default_;
    dVar14 = Globals::Discount();
    if (1.0 <= dVar14) {
      local_f8 = (double)local_4c;
    }
    else {
      dVar14 = Globals::Discount(local_4c);
      dVar16 = Globals::Discount();
      local_f8 = (1.0 - dVar14) / (1.0 - dVar16);
    }
    _i_1 = dVar1 * local_f8 + _i_1;
    if (((0 < *(int *)((long)value + 0x84)) &&
        (sVar10 = History::Size((History *)total_value), sVar10 != 0)) &&
       (OVar11 = History::LastObservation((History *)total_value), (OVar11 & 0xf) != 0)) {
      AVar4 = History::LastAction((History *)total_value);
      OVar11 = History::LastObservation((History *)total_value);
      bVar3 = CheckFlag((int)OVar11,AVar4);
      if (bVar3) {
        bVar3 = false;
        _ghost_pos = 1;
        while (!bVar3) {
          pCVar12 = (Coord *)((long)value + 0x20);
          register0x00000000 =
               despot::Coord::operator*((Coord *)(&Compass::DIRECTIONS + AVar4),_ghost_pos);
          local_94 = despot::operator+(pCVar12,(Coord *)((long)&dist + 4));
          for (dist._0_4_ = 0; dist._0_4_ < this->pocman_->num_ghosts_; dist._0_4_ = dist._0_4_ + 1)
          {
            pvVar13 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                                ((vector<despot::Coord,_std::allocator<despot::Coord>_> *)
                                 ((long)value + 0x28),(long)dist._0_4_);
            uVar6 = despot::operator==(pvVar13,(Coord *)&local_94);
            if ((uVar6 & 1) != 0) {
              dVar1 = this->pocman_->reward_eat_ghost_;
              dVar14 = Globals::Discount(_ghost_pos);
              _i_1 = dVar1 * dVar14 + _i_1;
              bVar3 = true;
              break;
            }
          }
          _ghost_pos = _ghost_pos + 1;
        }
      }
    }
    dStack_a8 = 0.0;
    for (local_ac = 0; local_ac < this->pocman_->num_ghosts_; local_ac = local_ac + 1) {
      uVar2 = *(undefined8 *)((long)value + 0x20);
      pvVar13 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                          ((vector<despot::Coord,_std::allocator<despot::Coord>_> *)
                           ((long)value + 0x28),(long)local_ac);
      iVar5 = despot::Coord::ManhattanDistance(uVar2,*(undefined8 *)pvVar13);
      dStack_a8 = (double)iVar5 + dStack_a8;
    }
    dVar1 = this->pocman_->reward_die_;
    dVar14 = Globals::Discount();
    dVar14 = pow(dVar14,dStack_a8 / (double)this->pocman_->num_ghosts_);
    _i_1 = dVar1 * dVar14 + _i_1;
    sVar10 = History::Size((History *)total_value);
    dVar1 = total_value;
    if (1 < sVar10) {
      sVar10 = History::Size((History *)total_value);
      AVar4 = History::Action((History *)dVar1,(int)sVar10 + -1);
      iVar5 = despot::Compass::Opposite(AVar4);
      dVar1 = total_value;
      sVar10 = History::Size((History *)total_value);
      AVar4 = History::Action((History *)dVar1,(int)sVar10 + -2);
      if (iVar5 == AVar4) {
        _i_1 = this->pocman_->reward_hit_wall_ / 2.0 + _i_1;
      }
    }
    dStack_30 = *(double *)((long)value + 0x18) * _i_1 + dStack_30;
    state._4_4_ = state._4_4_ + 1;
  } while( true );
}

Assistant:

double Value(const vector<State*>& particles,
		RandomStreams& streams, History& history) const {
		double total_value = 0;
		for (int i = 0; i < particles.size(); i++) {
			PocmanState& state = static_cast<PocmanState&>(*(particles[i]));
			double value = 0;

			int max_dist = 0;

			for (int i = 0; i < state.food.size(); i++) {
				if (state.food[i] != 1)
					continue;
				Coord food_pos = pocman_->maze_.GetCoord(i);
				int dist = Coord::ManhattanDistance(state.pocman_pos, food_pos);
				value += pocman_->reward_eat_food_ * Globals::Discount(dist);
				max_dist = max(max_dist, dist);
			}

			// Clear level
			value += pocman_->reward_clear_level_ * pow(Globals::config.discount, max_dist);

			// Default move-reward
			value += pocman_->reward_default_ * (Globals::Discount() < 1
					? (1 - Globals::Discount(max_dist)) / (1 - Globals::Discount())
					: max_dist);

			// If pocman is chasing a ghost, encourage it
			if (state.power_steps > 0 && history.Size() &&
					(history.LastObservation() & 15) != 0) {
				int act = history.LastAction();
				int obs = history.LastObservation();
				if (CheckFlag(obs, act)) {
					bool seen_ghost = false;
					for (int dist = 1; !seen_ghost; dist++) {
						Coord ghost_pos = state.pocman_pos + Compass::DIRECTIONS[act] * dist;
						for (int g = 0; g < pocman_->num_ghosts_; g++)
							if (state.ghost_pos[g] == ghost_pos) {
								value += pocman_->reward_eat_ghost_ * Globals::Discount(dist);
								seen_ghost = true;
								break;
							}
					}
				}
			}

			// Ghost penalties
			double dist = 0;
			for (int g = 0; g < pocman_->num_ghosts_; g++)
				dist += Coord::ManhattanDistance(state.pocman_pos, state.ghost_pos[g]);
			value += pocman_->reward_die_ * pow(Globals::Discount(), dist / pocman_->num_ghosts_);

			// Penalize for doubling back, but not so much as to prefer hitting a wall
			if (history.Size() >= 2 &&
					Compass::Opposite(history.Action(history.Size() - 1))
					== history.Action(history.Size() - 2))
				value += pocman_->reward_hit_wall_ / 2;

			total_value += state.weight * value;
		}

		return total_value;
	}